

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O3

bool duckdb::FSSTStorage::StringAnalyze(AnalyzeState *state_p,Vector *input,idx_t count)

{
  AnalyzeState *pAVar1;
  BlockManager *pBVar2;
  bool bVar3;
  idx_t iVar4;
  idx_t iVar5;
  AnalyzeState *pAVar6;
  ulong uVar7;
  iterator __position;
  ulong uVar8;
  ulong uVar9;
  string_t *data;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  UnifiedVectorFormat vdata;
  anon_union_16_2_67f50693_for_value local_88;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(input,count,&local_78);
  state_p[1].info.block_manager =
       (BlockManager *)((long)&(state_p[1].info.block_manager)->_vptr_BlockManager + count);
  if (*(char *)&state_p[0xb].info.block_manager == '\x01') {
    dVar12 = RandomEngine::NextRandom((RandomEngine *)&state_p[8].info);
    bVar3 = 0.25 <= dVar12;
  }
  else {
    bVar3 = false;
  }
  if (count == 0) {
    bVar11 = true;
  }
  else {
    pAVar1 = state_p + 8;
    bVar11 = false;
    uVar7 = 0;
    do {
      uVar9 = uVar7;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar9 = (ulong)(local_78.sel)->sel_vector[uVar7];
      }
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar9 >> 6] >>
           (uVar9 & 0x3f) & 1) != 0)) {
        uVar10 = (ulong)*(uint *)(local_78.data + uVar9 * 0x10);
        pBVar2 = (state_p->info).block_manager;
        iVar4 = optional_idx::GetIndex(&pBVar2->block_alloc_size);
        iVar5 = optional_idx::GetIndex(&pBVar2->block_header_size);
        uVar8 = iVar4 - iVar5 >> 2 & 0xfffffffffffffff8;
        if (0xfff < uVar8) {
          uVar8 = 0x1000;
        }
        if (uVar10 < uVar8 && !bVar3) {
          if (uVar10 == 0) {
            uVar10 = 1;
            pAVar6 = state_p + 0xc;
          }
          else {
            data = (string_t *)(local_78.data + uVar9 * 0x10);
            *(undefined1 *)&state_p[0xb].info.block_manager = 1;
            pAVar6 = pAVar1;
            if ((data->value).pointer.length < 0xd) {
              __position._M_current = (string_t *)state_p[7]._vptr_AnalyzeState;
              if ((BlockManager *)__position._M_current == state_p[7].info.block_manager) {
                ::std::vector<duckdb::string_t,std::allocator<duckdb::string_t>>::
                _M_realloc_insert<duckdb::string_t_const&>
                          ((vector<duckdb::string_t,std::allocator<duckdb::string_t>> *)
                           &state_p[6].info,__position,data);
              }
              else {
                uVar13 = *(undefined8 *)&data->value;
                uVar14 = (data->value).pointer.ptr;
LAB_016f7c4f:
                *(undefined8 *)&(__position._M_current)->value = uVar13;
                ((__position._M_current)->value).pointer.ptr = (char *)uVar14;
                state_p[7]._vptr_AnalyzeState = state_p[7]._vptr_AnalyzeState + 2;
              }
            }
            else {
              local_88.pointer =
                   (anon_struct_16_3_d7536bce_for_pointer)
                   StringHeap::AddBlob((StringHeap *)(state_p + 2),data);
              __position._M_current = (string_t *)state_p[7]._vptr_AnalyzeState;
              if ((BlockManager *)__position._M_current != state_p[7].info.block_manager) {
                uVar13 = local_88._0_8_;
                uVar14 = local_88.pointer.ptr;
                goto LAB_016f7c4f;
              }
              ::std::vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>::
              _M_realloc_insert<duckdb::string_t>
                        ((vector<duckdb::string_t,_std::allocator<duckdb::string_t>_> *)
                         &state_p[6].info,__position,(string_t *)&local_88.pointer);
            }
          }
          pAVar6->_vptr_AnalyzeState = (_func_int **)((long)pAVar6->_vptr_AnalyzeState + uVar10);
        }
        else if (uVar8 <= uVar10) break;
      }
      uVar7 = uVar7 + 1;
      bVar11 = count <= uVar7;
    } while (uVar7 != count);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return bVar11;
}

Assistant:

bool FSSTStorage::StringAnalyze(AnalyzeState &state_p, Vector &input, idx_t count) {
	auto &state = state_p.Cast<FSSTAnalyzeState>();
	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);

	state.count += count;
	auto data = UnifiedVectorFormat::GetData<string_t>(vdata);

	// Note that we ignore the sampling in case we have not found any valid strings yet, this solves the issue of
	// not having seen any valid strings here leading to an empty fsst symbol table.
	bool sample_selected = !state.have_valid_row || state.random_engine.NextRandom() < ANALYSIS_SAMPLE_SIZE;

	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);

		if (!vdata.validity.RowIsValid(idx)) {
			continue;
		}

		// We need to check all strings for this, otherwise we run in to trouble during compression if we miss ones
		auto string_size = data[idx].GetSize();
		if (string_size >= StringUncompressed::GetStringBlockLimit(state.info.GetBlockSize())) {
			return false;
		}

		if (!sample_selected) {
			continue;
		}

		if (string_size > 0) {
			state.have_valid_row = true;
			if (data[idx].IsInlined()) {
				state.fsst_strings.push_back(data[idx]);
			} else {
				state.fsst_strings.emplace_back(state.fsst_string_heap.AddBlob(data[idx]));
			}
			state.fsst_string_total_size += string_size;
		} else {
			state.empty_strings++;
		}
	}
	return true;
}